

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::removeUndoWatch(Solver *this,uint32 dl,Constraint *c)

{
  ConstraintDB *wl;
  pointer ppCVar1;
  bool bVar2;
  Constraint **ppCVar3;
  uint uVar4;
  ConstraintDB *uList;
  Constraint *local_10;
  
  wl = (this->levels_).super_type.ebo_.buf[dl - 1].undo;
  if ((wl != (ConstraintDB *)0x0) &&
     ((local_10 = c, this->lazyRem_ == (Dirty *)0x0 ||
      (bVar2 = Dirty::add(this->lazyRem_,dl - 1,wl,c), !bVar2)))) {
    ppCVar1 = (wl->ebo_).buf;
    ppCVar3 = std::
              __find_if<Clasp::Constraint**,__gnu_cxx::__ops::_Iter_equals_val<Clasp::Constraint*const>>
                        (ppCVar1,ppCVar1 + (wl->ebo_).size,&local_10);
    ppCVar1 = (wl->ebo_).buf;
    uVar4 = (wl->ebo_).size;
    if (ppCVar3 != ppCVar1 + uVar4) {
      uVar4 = uVar4 - 1;
      *ppCVar3 = ppCVar1[uVar4];
      (wl->ebo_).size = uVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool Solver::removeUndoWatch(uint32 dl, Constraint* c) {
	assert(dl != 0 && dl <= decisionLevel() );
	if (levels_[dl-1].undo) {
		ConstraintDB& uList = *levels_[dl-1].undo;
		if (!lazyRem_ || !lazyRem_->add(dl - 1, uList, c)) {
			ConstraintDB::iterator it = std::find(uList.begin(), uList.end(), c);
			if (it != uList.end()) {
				*it = uList.back();
				uList.pop_back();
				return true;
			}
		}
	}
	return false;
}